

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O2

void __thiscall OSTEIDeriv1_Writer::WriteFormDeriv(OSTEIDeriv1_Writer *this)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int local_35c;
  int local_358;
  int ncart4;
  string outvar;
  string full_idx_x;
  undefined1 local_308 [16];
  string local_2f8;
  uint local_2d4;
  int ncart4m;
  int ncart4p;
  int local_2c8;
  int iStack_2c4;
  undefined8 uStack_2c0;
  QAM am;
  string full_idx_y;
  string full_idx_z;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [8];
  undefined8 uStack_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [8];
  undefined8 uStack_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  undefined8 uStack_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [8];
  undefined8 uStack_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160 [8];
  undefined8 uStack_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [8];
  undefined8 uStack_138;
  string invar_4m;
  string invar_3m;
  string invar_2m;
  string invar_1m;
  string invar_4p;
  string invar_3p;
  string invar_2p;
  string invar_1p;
  
  QAM::QAM(&am,&(((this->super_OSTEI_Writer_Base).info_)->super_GeneratorInfoBase).finalam_);
  uVar5 = (uint)((am.qam._M_elems[0] + 1) * (am.qam._M_elems[0] + 2)) >> 1;
  if (am.qam._M_elems[0] < 0) {
    uVar5 = 0;
  }
  uVar7 = (uint)((am.qam._M_elems[1] + 2) * (am.qam._M_elems[1] + 1)) >> 1;
  ncart4 = (uint)((am.qam._M_elems[3] + 2) * (am.qam._M_elems[3] + 1)) >> 1;
  local_2d4 = (uint)((am.qam._M_elems[1] + 3) * (am.qam._M_elems[1] + 2)) >> 1;
  if (am.qam._M_elems[1] < -1) {
    local_2d4 = 0;
  }
  uVar8 = (uint)((am.qam._M_elems[2] + 3) * (am.qam._M_elems[2] + 2)) >> 1;
  if (am.qam._M_elems[2] < -1) {
    uVar8 = 0;
  }
  ncart4p = (uint)((am.qam._M_elems[3] + 3) * (am.qam._M_elems[3] + 2)) >> 1;
  if (am.qam._M_elems[3] < -1) {
    ncart4p = 0;
  }
  uVar10 = (uint)((am.qam._M_elems[1] + 1) * am.qam._M_elems[1]) >> 1;
  if (am.qam._M_elems[1] < 0) {
    uVar7 = 0;
  }
  if (am.qam._M_elems[1] < 1) {
    uVar10 = 0;
  }
  uVar4 = (uint)((am.qam._M_elems[2] + 1) * am.qam._M_elems[2]) >> 1;
  uVar1 = (uint)((am.qam._M_elems[2] + 2) * (am.qam._M_elems[2] + 1)) >> 1;
  if (am.qam._M_elems[2] < 0) {
    uVar1 = 0;
  }
  if (am.qam._M_elems[2] < 1) {
    uVar4 = 0;
  }
  ncart4m = (uint)((am.qam._M_elems[3] + 1) * am.qam._M_elems[3]) >> 1;
  if (am.qam._M_elems[3] < 0) {
    ncart4 = 0;
  }
  if (am.qam._M_elems[3] < 1) {
    ncart4m = 0;
  }
  HRRVarName_abi_cxx11_(&outvar,&am);
  iVar9 = am.qam._M_elems[0];
  std::__cxx11::string::string((string *)&local_150,"2a",(allocator *)&invar_2p);
  uVar11 = local_2d4;
  full_idx_x._M_dataplus._M_p._0_4_ = iVar9 + 1;
  if (local_150 == local_140) {
    local_308._8_8_ = uStack_138;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_150;
  }
  full_idx_x.field_2._8_8_ = local_148;
  local_148 = 0;
  local_140[0] = 0;
  local_150 = local_140;
  HRRVarName_abi_cxx11_(&invar_1p,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_150);
  iVar9 = am.qam._M_elems[1];
  std::__cxx11::string::string((string *)&local_170,"2b",(allocator *)&invar_3p);
  full_idx_x._M_dataplus._M_p._4_4_ = iVar9 + 1;
  if (local_170 == local_160) {
    local_308._8_8_ = uStack_158;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_170;
  }
  full_idx_x.field_2._8_8_ = local_168;
  local_168 = 0;
  local_160[0] = 0;
  local_170 = local_160;
  HRRVarName_abi_cxx11_(&invar_2p,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_170);
  iVar9 = am.qam._M_elems[2];
  std::__cxx11::string::string((string *)&local_190,"2c",(allocator *)&invar_4p);
  full_idx_x._M_string_length._0_4_ = iVar9 + 1;
  if (local_190 == local_180) {
    local_308._8_8_ = uStack_178;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_190;
  }
  full_idx_x.field_2._8_8_ = local_188;
  local_188 = 0;
  local_180[0] = 0;
  local_190 = local_180;
  HRRVarName_abi_cxx11_(&invar_3p,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_190);
  iVar9 = am.qam._M_elems[3];
  std::__cxx11::string::string((string *)&local_1b0,"2d",(allocator *)&invar_1m);
  full_idx_x._M_string_length._4_4_ = iVar9 + 1;
  if (local_1b0 == local_1a0) {
    local_308._8_8_ = uStack_198;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_1b0;
  }
  full_idx_x.field_2._8_8_ = local_1a8;
  local_1a8 = 0;
  local_1a0[0] = 0;
  local_1b0 = local_1a0;
  HRRVarName_abi_cxx11_(&invar_4p,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_1b0);
  iVar2 = am.qam._M_elems[3];
  iVar9 = am.qam._M_elems[0];
  uStack_2c0 = 0;
  std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&invar_2m);
  full_idx_x._M_dataplus._M_p._0_4_ = iVar9 + -1;
  full_idx_x._M_string_length._4_4_ = iVar2;
  if (local_1d0 == local_1c0) {
    local_308._8_8_ = uStack_1b8;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_1d0;
  }
  full_idx_x.field_2._8_8_ = local_1c8;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_1d0 = local_1c0;
  HRRVarName_abi_cxx11_(&invar_1m,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_1d0);
  iVar2 = am.qam._M_elems[1];
  iVar9 = am.qam._M_elems[0];
  uStack_2c0 = 0;
  std::__cxx11::string::string((string *)&local_1f0,"",(allocator *)&invar_3m);
  full_idx_x._M_dataplus._M_p._4_4_ = iVar2 + -1;
  full_idx_x._M_dataplus._M_p._0_4_ = iVar9;
  if (local_1f0 == local_1e0) {
    local_308._8_8_ = uStack_1d8;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_1f0;
  }
  full_idx_x.field_2._8_8_ = local_1e8;
  local_1e8 = 0;
  local_1e0[0] = 0;
  local_1f0 = local_1e0;
  HRRVarName_abi_cxx11_(&invar_2m,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_1f0);
  iVar2 = am.qam._M_elems[3];
  iVar9 = am.qam._M_elems[2];
  uStack_2c0 = 0;
  std::__cxx11::string::string((string *)&local_210,"",(allocator *)&invar_4m);
  full_idx_x._M_string_length._0_4_ = iVar9 + -1;
  full_idx_x._M_string_length._4_4_ = iVar2;
  if (local_210 == local_200) {
    local_308._8_8_ = uStack_1f8;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_210;
  }
  full_idx_x.field_2._8_8_ = local_208;
  local_208 = 0;
  local_200[0] = 0;
  local_210 = local_200;
  HRRVarName_abi_cxx11_(&invar_3m,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_210);
  iVar2 = am.qam._M_elems[3];
  iVar9 = am.qam._M_elems[2];
  iStack_2c4 = am.qam._M_elems[1];
  uStack_2c0 = 0;
  std::__cxx11::string::string((string *)&local_230,"",(allocator *)&full_idx_y);
  full_idx_x._M_string_length._4_4_ = iVar2 + -1;
  full_idx_x._M_string_length._0_4_ = iVar9;
  if (local_230 == local_220) {
    local_308._8_8_ = uStack_218;
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_308;
  }
  else {
    full_idx_x.field_2._M_allocated_capacity = (size_type)local_230;
  }
  full_idx_x.field_2._8_8_ = local_228;
  local_228 = 0;
  local_220[0] = 0;
  local_230 = local_220;
  HRRVarName_abi_cxx11_(&invar_4m,(QAM *)&full_idx_x);
  std::__cxx11::string::~string((string *)full_idx_x.field_2._M_local_buf);
  std::__cxx11::string::~string((string *)&local_230);
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "struct RecurInfo const * const aminfo_1 = &recurinfo_array[am_recur_map["
                          );
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,am.qam._M_elems[0]);
  std::operator<<(poVar3,"]];\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "struct RecurInfo const * const aminfo_2 = &recurinfo_array[am_recur_map["
                          );
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,am.qam._M_elems[1]);
  std::operator<<(poVar3,"]];\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "struct RecurInfo const * const aminfo_3 = &recurinfo_array[am_recur_map["
                          );
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,am.qam._M_elems[2]);
  std::operator<<(poVar3,"]];\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "struct RecurInfo const * const aminfo_4 = &recurinfo_array[am_recur_map["
                          );
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,am.qam._M_elems[3]);
  std::operator<<(poVar3,"]];\n");
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  full_idx_x._M_string_length._0_4_ = 0;
  full_idx_x._M_string_length._4_4_ = 0;
  full_idx_y._M_dataplus._M_p = (pointer)&full_idx_y.field_2;
  full_idx_y._M_string_length = 0;
  full_idx_z._M_dataplus._M_p = (pointer)&full_idx_z.field_2;
  full_idx_z._M_string_length = 0;
  full_idx_y.field_2._M_local_buf[0] = '\0';
  full_idx_x.field_2._M_allocated_capacity =
       full_idx_x.field_2._M_allocated_capacity & 0xffffffffffffff00;
  full_idx_z.field_2._M_local_buf[0] = '\0';
  full_idx_x._M_dataplus._M_p = (pointer)&full_idx_x.field_2;
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar3,"int idx_x, idx_y, idx_z;\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar3,"int startidx = 0;\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"for(int n1 = 0; n1 < ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar5);
  std::operator<<(poVar3,"; n1++)\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"for(int n2 = 0; n2 < ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar7);
  std::operator<<(poVar3,"; n2++)\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"for(int n3 = 0; n3 < ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar1);
  std::operator<<(poVar3,"; n3++)\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"for(int n4 = 0; n4 < ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,ncart4);
  std::operator<<(poVar3,"; n4++)\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  iVar9 = ((this->super_OSTEI_Writer_Base).info_)->deriv1_missing_center_;
  _local_2c8 = CONCAT44(iStack_2c4,iVar9);
  if (iVar9 == 0) {
LAB_001285fc:
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"// Second Center\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"struct RecurInfo const * aminfo_n2 = aminfo_2 + n2;\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_x = aminfo_n2->idx[0][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_y = aminfo_n2->idx[1][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_z = aminfo_n2->idx[2][2];\n");
    iVar9 = uVar11 * uVar1;
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar1;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [8])"+idx_x*",&local_35c,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar1;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [8])"+idx_y*",&local_35c,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = iVar9 * ncart4;
    local_35c = ncart4 * uVar1;
    StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [8])"+idx_z*",&local_35c,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 3] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_2p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 4] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_2p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 5] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_2p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
    std::operator<<(poVar3,"];\n");
    if (0 < am.qam._M_elems[1]) {
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_x = aminfo_n2->idx[0][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_y = aminfo_n2->idx[1][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_z = aminfo_n2->idx[2][0];\n");
      iVar9 = uVar10 * uVar1;
      local_358 = ncart4 * iVar9;
      local_35c = ncart4 * uVar1;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [8])"+idx_x*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = ncart4 * iVar9;
      local_35c = ncart4 * uVar1;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [8])"+idx_y*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = iVar9 * ncart4;
      local_35c = ncart4 * uVar1;
      StringBuilder<char[4],int,char_const(&)[8],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [8])"+idx_z*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_x >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 3] -= aminfo_n2->ijk[0] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_2m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_y >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 4] -= aminfo_n2->ijk[1] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_2m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_z >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 5] -= aminfo_n2->ijk[2] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_2m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
      std::operator<<(poVar3,"];\n");
    }
    if (local_2c8 != 2) goto LAB_00128c26;
LAB_001293fa:
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"// Fourth Center\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"struct RecurInfo const * aminfo_n4 = aminfo_4 + n4;\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_x = aminfo_n4->idx[0][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_y = aminfo_n4->idx[1][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_z = aminfo_n4->idx[2][2];\n");
    iVar9 = uVar7 * uVar1;
    local_358 = ncart4p * iVar9;
    local_35c = ncart4p * uVar1;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [5])"+n3*",&ncart4p,(char (*) [7])"+idx_x");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = ncart4p * iVar9;
    local_35c = ncart4p * uVar1;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [5])"+n3*",&ncart4p,(char (*) [7])"+idx_y");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = ncart4p * iVar9;
    local_35c = ncart4p * uVar1;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [5])"+n3*",&ncart4p,(char (*) [7])"+idx_z");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx +  9] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_4p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 10] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_4p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 11] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_4p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
    std::operator<<(poVar3,"];\n");
    if (0 < am.qam._M_elems[3]) {
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_x = aminfo_n4->idx[0][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_y = aminfo_n4->idx[1][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_z = aminfo_n4->idx[2][0];\n");
      local_358 = ncart4m * iVar9;
      local_35c = ncart4m * uVar1;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4m,(char (*) [7])"+idx_x");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = ncart4m * iVar9;
      local_35c = ncart4m * uVar1;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4m,(char (*) [7])"+idx_y");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = iVar9 * ncart4m;
      local_35c = uVar1 * ncart4m;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[7]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4m,(char (*) [7])"+idx_z");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_x >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx +  9] -= aminfo_n4->ijk[0] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_4m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_y >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 10] -= aminfo_n4->ijk[1] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_4m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_z >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 11] -= aminfo_n4->ijk[2] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_4m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
      std::operator<<(poVar3,"];\n");
    }
    if (local_2c8 == 2) {
      std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"// Third Center\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 6] = -(");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 0] + ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 3] + ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      std::operator<<(poVar3,"[startidx +  9]);\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 7] = -(");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 1] + ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 4] + ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      std::operator<<(poVar3,"[startidx + 10]);\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 8] = -(");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 2] + ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      pcVar6 = "[startidx + 5] + ";
    }
    else {
      if (local_2c8 == 1) {
        std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        std::operator<<(poVar3,"// Second Center\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 3] = -(");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 0] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 6] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        std::operator<<(poVar3,"[startidx +  9]);\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 4] = -(");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 1] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 7] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        std::operator<<(poVar3,"[startidx + 10]);\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 5] = -(");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        pcVar6 = "[startidx + 2] + ";
      }
      else {
        if (local_2c8 != 0) goto LAB_00129ef8;
        std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        std::operator<<(poVar3,"// First Center\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 0] = -(");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 3] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 6] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        std::operator<<(poVar3,"[startidx +  9]);\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 1] = -(");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 4] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 7] + ");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        std::operator<<(poVar3,"[startidx + 10]);\n");
        poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        poVar3 = std::operator<<(poVar3,"[startidx + 2] = -(");
        poVar3 = std::operator<<(poVar3,(string *)&outvar);
        pcVar6 = "[startidx + 5] + ";
      }
      poVar3 = std::operator<<(poVar3,pcVar6);
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      pcVar6 = "[startidx + 8] + ";
    }
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    pcVar6 = "[startidx + 11]);\n";
  }
  else {
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"// First Center\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"struct RecurInfo const * aminfo_n1 = aminfo_1 + n1;\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_x = aminfo_n1->idx[0][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_y = aminfo_n1->idx[1][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_z = aminfo_n1->idx[2][2];\n");
    iVar9 = uVar1 * uVar7;
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar1;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [7])0x13ca85,&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar1;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [7])0x13ca8d,&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar1;
    StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [7])0x13ca95,&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    uVar11 = local_2d4;
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 0] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_1p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 1] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_1p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 2] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_1p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
    std::operator<<(poVar3,"];\n");
    if (0 < am.qam._M_elems[0]) {
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_x = aminfo_n1->idx[0][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_y = aminfo_n1->idx[1][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_z = aminfo_n1->idx[2][0];\n");
      local_358 = ncart4 * iVar9;
      local_35c = ncart4 * uVar1;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [7])0x13ca85,&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = ncart4 * iVar9;
      local_35c = ncart4 * uVar1;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [7])0x13ca8d,&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = iVar9 * ncart4;
      local_35c = ncart4 * uVar1;
      StringBuilder<char[7],int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [7])0x13ca95,&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [5])"+n3*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      uVar11 = local_2d4;
      poVar3 = std::operator<<(poVar3,"if(idx_x >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 0] -= aminfo_n1->ijk[0] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_1m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_y >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 1] -= aminfo_n1->ijk[1] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_1m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_z >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 2] -= aminfo_n1->ijk[2] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_1m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
      std::operator<<(poVar3,"];\n");
    }
    if (local_2c8 != 1) goto LAB_001285fc;
LAB_00128c26:
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"// Third Center\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"struct RecurInfo const * aminfo_n3 = aminfo_3 + n3;\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_x = aminfo_n3->idx[0][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_y = aminfo_n3->idx[1][2];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"idx_z = aminfo_n3->idx[2][2];\n");
    iVar9 = uVar8 * uVar7;
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar8;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [8])"+idx_x*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = ncart4 * iVar9;
    local_35c = ncart4 * uVar8;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [8])"+idx_y*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_358 = iVar9 * ncart4;
    local_35c = uVar8 * ncart4;
    StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
              (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
               (char (*) [8])"+idx_z*",&ncart4,(char (*) [4])"+n4");
    std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 6] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_3p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 7] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_3p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
    std::operator<<(poVar3,"];\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 8] = ");
    poVar3 = std::operator<<(poVar3,(string *)&invar_3p);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
    std::operator<<(poVar3,"];\n");
    if (0 < am.qam._M_elems[2]) {
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_x = aminfo_n3->idx[0][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_y = aminfo_n3->idx[1][0];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      std::operator<<(poVar3,"idx_z = aminfo_n3->idx[2][0];\n");
      iVar9 = uVar4 * uVar7;
      local_358 = ncart4 * iVar9;
      local_35c = ncart4 * uVar4;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [8])"+idx_x*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_x,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = ncart4 * iVar9;
      local_35c = ncart4 * uVar4;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [8])"+idx_y*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_y,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_358 = iVar9 * ncart4;
      local_35c = uVar4 * ncart4;
      StringBuilder<char[4],int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                (&local_2f8,(char (*) [4])"n1*",&local_358,(char (*) [5])"+n2*",&local_35c,
                 (char (*) [8])"+idx_z*",&ncart4,(char (*) [4])"+n4");
      std::__cxx11::string::operator=((string *)&full_idx_z,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_x >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 6] -= aminfo_n3->ijk[0] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_3m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_x);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_y >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 7] -= aminfo_n3->ijk[1] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_3m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_y);
      std::operator<<(poVar3,"];\n");
      poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"if(idx_z >= 0) ");
      poVar3 = std::operator<<(poVar3,(string *)&outvar);
      poVar3 = std::operator<<(poVar3,"[startidx + 8] -= aminfo_n3->ijk[2] * ");
      poVar3 = std::operator<<(poVar3,(string *)&invar_3m);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,(string *)&full_idx_z);
      std::operator<<(poVar3,"];\n");
    }
    if (local_2c8 != 3) goto LAB_001293fa;
    std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    std::operator<<(poVar3,"// Fourth Center\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx +  9] = -(");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 0] + ");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 3] + ");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    std::operator<<(poVar3,"[startidx + 6]);\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 10] = -(");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 1] + ");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 4] + ");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    std::operator<<(poVar3,"[startidx + 7]);\n");
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 11] = -(");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 2] + ");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    poVar3 = std::operator<<(poVar3,"[startidx + 5] + ");
    poVar3 = std::operator<<(poVar3,(string *)&outvar);
    pcVar6 = "[startidx + 8]);\n";
  }
  std::operator<<(poVar3,pcVar6);
LAB_00129ef8:
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"startidx += 12;\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar3,"} // close loop for forming derivatives\n\n");
  std::__cxx11::string::~string((string *)&full_idx_z);
  std::__cxx11::string::~string((string *)&full_idx_y);
  std::__cxx11::string::~string((string *)&full_idx_x);
  std::__cxx11::string::~string((string *)&invar_4m);
  std::__cxx11::string::~string((string *)&invar_3m);
  std::__cxx11::string::~string((string *)&invar_2m);
  std::__cxx11::string::~string((string *)&invar_1m);
  std::__cxx11::string::~string((string *)&invar_4p);
  std::__cxx11::string::~string((string *)&invar_3p);
  std::__cxx11::string::~string((string *)&invar_2p);
  std::__cxx11::string::~string((string *)&invar_1p);
  std::__cxx11::string::~string((string *)&outvar);
  std::__cxx11::string::~string((string *)&am.tag);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteFormDeriv(void) const
{
    QAM am = info_.FinalAM();
    const int ncart1 = NCART(am[0]);
    const int ncart2 = NCART(am[1]);
    const int ncart3 = NCART(am[2]);
    const int ncart4 = NCART(am[3]);

    const int ncart2p = NCART(am[1]+1);
    const int ncart3p = NCART(am[2]+1);
    const int ncart4p = NCART(am[3]+1);
    const int ncart2m = NCART(am[1]-1);
    const int ncart3m = NCART(am[2]-1);
    const int ncart4m = NCART(am[3]-1);

    std::string outvar = HRRVarName(am);
    std::string invar_1p = HRRVarName(QAM({am[0]+1, am[1]  , am[2]  , am[3]  }, "2a"));
    std::string invar_2p = HRRVarName(QAM({am[0],   am[1]+1, am[2]  , am[3]  }, "2b"));
    std::string invar_3p = HRRVarName(QAM({am[0],   am[1]  , am[2]+1, am[3]  }, "2c"));
    std::string invar_4p = HRRVarName(QAM({am[0],   am[1]  , am[2]  , am[3]+1}, "2d"));
    std::string invar_1m = HRRVarName({am[0]-1, am[1]  , am[2]  , am[3]  });
    std::string invar_2m = HRRVarName({am[0],   am[1]-1, am[2]  , am[3]  });
    std::string invar_3m = HRRVarName({am[0],   am[1]  , am[2]-1, am[3]  });
    std::string invar_4m = HRRVarName({am[0],   am[1]  , am[2]  , am[3]-1});

    os_ << indent4 << "struct RecurInfo const * const aminfo_1 = &recurinfo_array[am_recur_map[" << am[0] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_2 = &recurinfo_array[am_recur_map[" << am[1] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_3 = &recurinfo_array[am_recur_map[" << am[2] << "]];\n";
    os_ << indent4 << "struct RecurInfo const * const aminfo_4 = &recurinfo_array[am_recur_map[" << am[3] << "]];\n";
    os_ << "\n";

    std::string full_idx_x, full_idx_y, full_idx_z;
    //os_ << indent4 << "double * restrict " << outvar << " = " << ArrVarName(am)
    //               << " + real_abcd * " << ncart1*ncart2*ncart3*ncart4 << " * 12;\n\n";
    os_ << indent4 << "int idx_x, idx_y, idx_z;\n";
    os_ << indent4 << "int startidx = 0;\n";
    os_ << indent4 << "for(int n1 = 0; n1 < " << ncart1 << "; n1++)\n";
    os_ << indent4 << "for(int n2 = 0; n2 < " << ncart2 << "; n2++)\n";
    os_ << indent4 << "for(int n3 = 0; n3 < " << ncart3 << "; n3++)\n";
    os_ << indent4 << "for(int n4 = 0; n4 < " << ncart4 << "; n4++)\n";
    os_ << indent4 << "{\n";

    int missing_center = info_.Deriv1_MissingCenter();

    if(missing_center != 0)
    {
        os_ << "\n\n";
        os_ << indent5 << "// First Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n1 = aminfo_1 + n1;\n";
        os_ << indent5 << "idx_x = aminfo_n1->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n1->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n1->idx[2][2];\n";
        full_idx_x = StringBuilder("idx_x*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_y = StringBuilder("idx_y*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_z = StringBuilder("idx_z*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 0] = " << invar_1p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 1] = " << invar_1p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 2] = " << invar_1p << "[" << full_idx_z << "];\n";

        if(am[0] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n1->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n1->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n1->idx[2][0];\n";
            full_idx_x = StringBuilder("idx_x*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_y = StringBuilder("idx_y*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_z = StringBuilder("idx_z*", ncart2*ncart3*ncart4, "+n2*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 0] -= aminfo_n1->ijk[0] * " << invar_1m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 1] -= aminfo_n1->ijk[1] * " << invar_1m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 2] -= aminfo_n1->ijk[2] * " << invar_1m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 1)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Second Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n2 = aminfo_2 + n2;\n";
        os_ << indent5 << "idx_x = aminfo_n2->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n2->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n2->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_x*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_y = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_y*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        full_idx_z = StringBuilder("n1*", ncart2p*ncart3*ncart4, "+idx_z*", ncart3*ncart4, "+n3*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 3] = " << invar_2p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 4] = " << invar_2p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 5] = " << invar_2p << "[" << full_idx_z << "];\n";

        if(am[1] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n2->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n2->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n2->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_x*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_y = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_y*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            full_idx_z = StringBuilder("n1*", ncart2m*ncart3*ncart4, "+idx_z*", ncart3*ncart4, "+n3*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 3] -= aminfo_n2->ijk[0] * " << invar_2m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 4] -= aminfo_n2->ijk[1] * " << invar_2m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 5] -= aminfo_n2->ijk[2] * " << invar_2m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 2)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Third Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n3 = aminfo_3 + n3;\n";
        os_ << indent5 << "idx_x = aminfo_n3->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n3->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n3->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_x*", ncart4, "+n4");
        full_idx_y = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_y*", ncart4, "+n4");
        full_idx_z = StringBuilder("n1*", ncart2*ncart3p*ncart4, "+n2*", ncart3p*ncart4, "+idx_z*", ncart4, "+n4");
        os_ << indent5 << outvar << "[startidx + 6] = " << invar_3p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 7] = " << invar_3p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 8] = " << invar_3p << "[" << full_idx_z << "];\n";

        if(am[2] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n3->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n3->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n3->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_x*", ncart4, "+n4");
            full_idx_y = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_y*", ncart4, "+n4");
            full_idx_z = StringBuilder("n1*", ncart2*ncart3m*ncart4, "+n2*", ncart3m*ncart4, "+idx_z*", ncart4, "+n4");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx + 6] -= aminfo_n3->ijk[0] * " << invar_3m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 7] -= aminfo_n3->ijk[1] * " << invar_3m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 8] -= aminfo_n3->ijk[2] * " << invar_3m << "[" << full_idx_z << "];\n";
        }
    }


    if(missing_center != 3)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Fourth Center\n";
        os_ << indent5 << "struct RecurInfo const * aminfo_n4 = aminfo_4 + n4;\n";
        os_ << indent5 << "idx_x = aminfo_n4->idx[0][2];\n";
        os_ << indent5 << "idx_y = aminfo_n4->idx[1][2];\n";
        os_ << indent5 << "idx_z = aminfo_n4->idx[2][2];\n";
        full_idx_x = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_x");
        full_idx_y = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_y");
        full_idx_z = StringBuilder("n1*", ncart2*ncart3*ncart4p, "+n2*", ncart3*ncart4p, "+n3*", ncart4p, "+idx_z");
        os_ << indent5 << outvar << "[startidx +  9] = " << invar_4p << "[" << full_idx_x << "];\n";
        os_ << indent5 << outvar << "[startidx + 10] = " << invar_4p << "[" << full_idx_y << "];\n";
        os_ << indent5 << outvar << "[startidx + 11] = " << invar_4p << "[" << full_idx_z << "];\n";

        if(am[3] > 0)
        {
            os_ << indent5 << "idx_x = aminfo_n4->idx[0][0];\n";
            os_ << indent5 << "idx_y = aminfo_n4->idx[1][0];\n";
            os_ << indent5 << "idx_z = aminfo_n4->idx[2][0];\n";
            full_idx_x = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_x");
            full_idx_y = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_y");
            full_idx_z = StringBuilder("n1*", ncart2*ncart3*ncart4m, "+n2*", ncart3*ncart4m, "+n3*", ncart4m, "+idx_z");
            os_ << indent5 << "if(idx_x >= 0) " << outvar << "[startidx +  9] -= aminfo_n4->ijk[0] * " << invar_4m << "[" << full_idx_x << "];\n";
            os_ << indent5 << "if(idx_y >= 0) " << outvar << "[startidx + 10] -= aminfo_n4->ijk[1] * " << invar_4m << "[" << full_idx_y << "];\n";
            os_ << indent5 << "if(idx_z >= 0) " << outvar << "[startidx + 11] -= aminfo_n4->ijk[2] * " << invar_4m << "[" << full_idx_z << "];\n";
        }
    }

    if(missing_center == 0)
    {
        os_ << "\n\n";
        os_ << indent5 << "// First Center\n";
        os_ << indent5 << outvar << "[startidx + 0] = -(" << outvar << "[startidx + 3] + " << outvar << "[startidx + 6] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 1] = -(" << outvar << "[startidx + 4] + " << outvar << "[startidx + 7] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 2] = -(" << outvar << "[startidx + 5] + " << outvar << "[startidx + 8] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 1)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Second Center\n";
        os_ << indent5 << outvar << "[startidx + 3] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 6] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 4] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 7] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 5] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 8] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 2)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Third Center\n";
        os_ << indent5 << outvar << "[startidx + 6] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 3] + " << outvar << "[startidx +  9]);\n";
        os_ << indent5 << outvar << "[startidx + 7] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 4] + " << outvar << "[startidx + 10]);\n";
        os_ << indent5 << outvar << "[startidx + 8] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 5] + " << outvar << "[startidx + 11]);\n";
    }

    if(missing_center == 3)
    {
        os_ << "\n\n";
        os_ << indent5 << "// Fourth Center\n";
        os_ << indent5 << outvar << "[startidx +  9] = -(" << outvar << "[startidx + 0] + " << outvar << "[startidx + 3] + " << outvar << "[startidx + 6]);\n";
        os_ << indent5 << outvar << "[startidx + 10] = -(" << outvar << "[startidx + 1] + " << outvar << "[startidx + 4] + " << outvar << "[startidx + 7]);\n";
        os_ << indent5 << outvar << "[startidx + 11] = -(" << outvar << "[startidx + 2] + " << outvar << "[startidx + 5] + " << outvar << "[startidx + 8]);\n";
    }

    os_ << "\n\n";
    os_ << indent5 << "startidx += 12;\n";
    os_ << indent4 << "} // close loop for forming derivatives\n\n";

}